

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int PKCS12_parse(PKCS12 *p12,char *password,EVP_PKEY **out_pkey,X509 **out_cert,
                stack_st_X509 **out_ca_certs)

{
  bool bVar1;
  int iVar2;
  X509 *pXVar3;
  X509 *x509;
  X509 *cert;
  size_t i;
  size_t num_certs;
  stack_st_X509 *psStack_50;
  char ca_certs_alloced;
  stack_st_X509 *ca_certs;
  CBS ber_bytes;
  stack_st_X509 **out_ca_certs_local;
  X509 **out_cert_local;
  EVP_PKEY **out_pkey_local;
  char *password_local;
  PKCS12 *p12_local;
  
  psStack_50 = (stack_st_X509 *)0x0;
  bVar1 = false;
  if ((out_ca_certs != (stack_st_X509 **)0x0) && (*out_ca_certs != (stack_st_X509 *)0x0)) {
    psStack_50 = *out_ca_certs;
  }
  ber_bytes.len = (size_t)out_ca_certs;
  if (psStack_50 == (stack_st_X509 *)0x0) {
    psStack_50 = sk_X509_new_null();
    if (psStack_50 == (stack_st_X509 *)0x0) {
      return 0;
    }
    bVar1 = true;
  }
  CBS_init((CBS *)&ca_certs,p12->ber_bytes,p12->ber_len);
  iVar2 = PKCS12_get_key_and_certs(out_pkey,psStack_50,(CBS *)&ca_certs,password);
  if (iVar2 == 0) {
    if (bVar1) {
      sk_X509_free(psStack_50);
    }
    p12_local._4_4_ = 0;
  }
  else {
    *out_cert = (X509 *)0x0;
    pXVar3 = (X509 *)sk_X509_num(psStack_50);
    if ((*out_pkey != (EVP_PKEY *)0x0) && (cert = pXVar3, pXVar3 != (X509 *)0x0)) {
      while (cert = (X509 *)((long)&cert[-1].lock + 0x37), cert < pXVar3) {
        x509 = (X509 *)sk_X509_value(psStack_50,(size_t)cert);
        iVar2 = X509_check_private_key(x509,(EVP_PKEY *)*out_pkey);
        if (iVar2 != 0) {
          *out_cert = (X509 *)x509;
          sk_X509_delete(psStack_50,(size_t)cert);
          break;
        }
        ERR_clear_error();
      }
    }
    if (ber_bytes.len == 0) {
      sk_X509_pop_free(psStack_50,X509_free);
    }
    else {
      *(stack_st_X509 **)ber_bytes.len = psStack_50;
    }
    p12_local._4_4_ = 1;
  }
  return p12_local._4_4_;
}

Assistant:

int PKCS12_parse(const PKCS12 *p12, const char *password, EVP_PKEY **out_pkey,
                 X509 **out_cert, STACK_OF(X509) **out_ca_certs) {
  CBS ber_bytes;
  STACK_OF(X509) *ca_certs = NULL;
  char ca_certs_alloced = 0;

  if (out_ca_certs != NULL && *out_ca_certs != NULL) {
    ca_certs = *out_ca_certs;
  }

  if (!ca_certs) {
    ca_certs = sk_X509_new_null();
    if (ca_certs == NULL) {
      return 0;
    }
    ca_certs_alloced = 1;
  }

  CBS_init(&ber_bytes, p12->ber_bytes, p12->ber_len);
  if (!PKCS12_get_key_and_certs(out_pkey, ca_certs, &ber_bytes, password)) {
    if (ca_certs_alloced) {
      sk_X509_free(ca_certs);
    }
    return 0;
  }

  // OpenSSL selects the last certificate which matches the private key as
  // |out_cert|.
  *out_cert = NULL;
  size_t num_certs = sk_X509_num(ca_certs);
  if (*out_pkey != NULL && num_certs > 0) {
    for (size_t i = num_certs - 1; i < num_certs; i--) {
      X509 *cert = sk_X509_value(ca_certs, i);
      if (X509_check_private_key(cert, *out_pkey)) {
        *out_cert = cert;
        sk_X509_delete(ca_certs, i);
        break;
      }
      ERR_clear_error();
    }
  }

  if (out_ca_certs) {
    *out_ca_certs = ca_certs;
  } else {
    sk_X509_pop_free(ca_certs, X509_free);
  }

  return 1;
}